

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

void Search::end_pass(search *sch)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint __val;
  search_private *psVar2;
  vw *pvVar3;
  options_i *poVar4;
  bool bVar5;
  char cVar6;
  char cVar7;
  typed_option<unsigned_int> *this;
  uint uVar8;
  ulong uVar9;
  string __str;
  string local_70;
  char *local_50;
  uint local_48;
  char local_40 [16];
  
  psVar2 = sch->priv;
  pvVar3 = psVar2->all;
  psVar2->hit_new_pass = true;
  uVar9 = psVar2->passes_since_new_policy + 1;
  psVar2->passes_since_new_policy = uVar9;
  psVar2->read_example_last_pass = psVar2->read_example_last_pass + 1;
  if (psVar2->passes_per_policy <= uVar9) {
    psVar2->passes_since_new_policy = 0;
    if (pvVar3->training == true) {
      psVar2->current_policy = psVar2->current_policy + 1;
    }
    if (psVar2->total_number_of_policies < psVar2->current_policy) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"internal error (bug): too many policies; not advancing",0x36
                );
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      psVar2->current_policy = psVar2->total_number_of_policies;
    }
    poVar4 = pvVar3->options;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"search_trained_nb_policies","");
    __val = psVar2->current_policy;
    cVar7 = '\x01';
    if (9 < __val) {
      uVar8 = __val;
      cVar6 = '\x04';
      do {
        cVar7 = cVar6;
        if (uVar8 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_00122a56;
        }
        if (uVar8 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_00122a56;
        }
        if (uVar8 < 10000) goto LAB_00122a56;
        bVar5 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        cVar6 = cVar7 + '\x04';
      } while (bVar5);
      cVar7 = cVar7 + '\x01';
    }
LAB_00122a56:
    local_50 = local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,cVar7);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_50,local_48,__val);
    (*poVar4->_vptr_options_i[6])(poVar4,&local_70,&local_50);
    paVar1 = &local_70.field_2;
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    poVar4 = pvVar3->options;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"search_trained_nb_policies","");
    this = VW::config::options_i::get_typed_option<unsigned_int>(poVar4,&local_70);
    VW::config::typed_option<unsigned_int>::value(this,psVar2->current_policy);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void end_pass(search& sch)
{
  search_private& priv = *sch.priv;
  vw* all = priv.all;
  priv.hit_new_pass = true;
  priv.read_example_last_pass++;
  priv.passes_since_new_policy++;

  if (priv.passes_since_new_policy >= priv.passes_per_policy)
  {
    priv.passes_since_new_policy = 0;
    if (all->training)
      priv.current_policy++;
    if (priv.current_policy > priv.total_number_of_policies)
    {
      std::cerr << "internal error (bug): too many policies; not advancing" << std::endl;
      priv.current_policy = priv.total_number_of_policies;
    }
    // reset search_trained_nb_policies in options_from_file so it is saved to regressor file later
    // TODO work out a better system to update state that will be saved in the model.
    all->options->replace("search_trained_nb_policies", std::to_string(priv.current_policy));
    all->options->get_typed_option<uint32_t>("search_trained_nb_policies").value(priv.current_policy);
  }
}